

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.cpp
# Opt level: O0

void __thiscall de::DynamicLibrary::DynamicLibrary(DynamicLibrary *this,char *fileName)

{
  deDynamicLibrary *pdVar1;
  runtime_error *this_00;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *fileName_local;
  DynamicLibrary *this_local;
  
  this->m_library = (deDynamicLibrary *)0x0;
  local_18 = fileName;
  fileName_local = (char *)this;
  pdVar1 = deDynamicLibrary_open(fileName);
  this->m_library = pdVar1;
  if (this->m_library == (deDynamicLibrary *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Failed to open dynamic library: \'",&local_79);
    std::operator+(&local_58,&local_78,local_18);
    std::operator+(&local_38,&local_58,"\'");
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

DynamicLibrary::DynamicLibrary (const char* fileName)
	: m_library(DE_NULL)
{
	m_library = deDynamicLibrary_open(fileName);
	if (!m_library)
		throw std::runtime_error(std::string("Failed to open dynamic library: '") + fileName + "'");
}